

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O0

int match_short(parg_state *ps,int argc,char **argv,char *optstring)

{
  int iVar1;
  char *pcVar2;
  char *p;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  parg_state *ps_local;
  
  pcVar2 = strchr(optstring,(int)*ps->nextchar);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = ps->nextchar;
    ps->nextchar = pcVar2 + 1;
    ps->optopt = (int)*pcVar2;
    ps_local._4_4_ = 0x3f;
  }
  else if (pcVar2[1] == ':') {
    if (ps->nextchar[1] == '\0') {
      if (pcVar2[2] == ':') {
        pcVar2 = ps->nextchar;
        ps->nextchar = pcVar2 + 1;
        ps_local._4_4_ = (int)*pcVar2;
      }
      else {
        iVar1 = is_argv_end(ps,argc,argv);
        if (iVar1 == 0) {
          iVar1 = ps->optind;
          ps->optind = iVar1 + 1;
          ps->optarg = argv[iVar1];
          ps->nextchar = (char *)0x0;
          ps_local._4_4_ = (int)*pcVar2;
        }
        else {
          pcVar2 = ps->nextchar;
          ps->nextchar = pcVar2 + 1;
          ps->optopt = (int)*pcVar2;
          ps_local._4_4_ = 0x3f;
          if (*optstring == ':') {
            ps_local._4_4_ = 0x3a;
          }
        }
      }
    }
    else {
      ps->optarg = ps->nextchar + 1;
      ps->nextchar = (char *)0x0;
      ps_local._4_4_ = (int)*pcVar2;
    }
  }
  else {
    pcVar2 = ps->nextchar;
    ps->nextchar = pcVar2 + 1;
    ps_local._4_4_ = (int)*pcVar2;
  }
  return ps_local._4_4_;
}

Assistant:

static int
match_short(struct parg_state *ps, int argc, char *const argv[],
            const char *optstring)
{
	const char *p = strchr(optstring, *ps->nextchar);

	if (p == NULL) {
		ps->optopt = *ps->nextchar++;
		return '?';
	}

	/* If no option argument, return option */
	if (p[1] != ':') {
		return *ps->nextchar++;
	}

	/* If more characters, return as option argument */
	if (ps->nextchar[1] != '\0') {
		ps->optarg = &ps->nextchar[1];
		ps->nextchar = NULL;
		return *p;
	}

	/* If option argument is optional, return option */
	if (p[2] == ':') {
		return *ps->nextchar++;
	}

	/* Option argument required, so return next argv element */
	if (is_argv_end(ps, argc, argv)) {
		ps->optopt = *ps->nextchar++;
		return optstring[0] == ':' ? ':' : '?';
	}

	ps->optarg = argv[ps->optind++];
	ps->nextchar = NULL;
	return *p;
}